

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O0

bool __thiscall pstore::command_line::option::can_accept_another_occurrence(option *this)

{
  int iVar1;
  bool local_11;
  bool result;
  option *this_local;
  
  local_11 = true;
  iVar1 = (*this->_vptr_option[3])();
  switch(iVar1) {
  case 0:
  case 2:
    local_11 = this->num_occurrences_ == 0;
    break;
  case 1:
  case 3:
  }
  return local_11;
}

Assistant:

bool option::can_accept_another_occurrence () const {
                bool result = true;
                switch (this->get_num_occurrences_flag ()) {
                case num_occurrences_flag::optional:
                case num_occurrences_flag::required: result = num_occurrences_ == 0U; break;
                case num_occurrences_flag::zero_or_more:
                case num_occurrences_flag::one_or_more: break;
                }
                return result;
            }